

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_waveops.cpp
# Opt level: O2

bool dxil_spv::get_constant_int(Value *value,uint32_t *const_value)

{
  Constant *this;
  APInt *this_00;
  uint64_t uVar1;
  
  this = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(value)->super_Constant;
  if (this != (Constant *)0x0) {
    this_00 = LLVMBC::Constant::getUniqueInteger(this);
    uVar1 = LLVMBC::APInt::getZExtValue(this_00);
    *const_value = (uint32_t)uVar1;
  }
  return this != (Constant *)0x0;
}

Assistant:

static bool get_constant_int(const llvm::Value *value, uint32_t *const_value)
{
	if (const auto *c = llvm::dyn_cast<llvm::ConstantInt>(value))
	{
		*const_value = uint32_t(c->getUniqueInteger().getZExtValue());
		return true;
	}
	else
		return false;
}